

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGeneratorObjectStrings::MaybeConvertToRelativePath
          (string *__return_storage_ptr__,cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  bool bVar1;
  char *pcVar2;
  cmStateDirectory *this_00;
  allocator local_41;
  string local_40;
  
  this_00 = &this->StateDir;
  pcVar2 = cmStateDirectory::GetCurrentBinary(this_00);
  std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
  bVar1 = cmOutputConverter::ContainedInDirectory(&local_40,obj,this_00);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    pcVar2 = cmStateDirectory::GetCurrentBinary(this_00);
    std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
    cmOutputConverter::ForceToRelativePath(__return_storage_ptr__,&local_40,obj);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)obj);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MaybeConvertToRelativePath(std::string const& obj)
  {
    if (!cmOutputConverter::ContainedInDirectory(
          this->StateDir.GetCurrentBinary(), obj, this->StateDir)) {
      return obj;
    }
    return cmOutputConverter::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), obj);
  }